

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O2

void emitter_dict_begin(emitter_t *emitter,char *json_key,char *table_header)

{
  if (emitter->output == emitter_output_table) {
    emitter_indent(emitter);
    emitter_printf(emitter,"%s\n",table_header);
    emitter->nesting_depth = emitter->nesting_depth + 1;
    emitter->item_at_depth = false;
  }
  else if (emitter->output == emitter_output_json) {
    emitter_json_key(emitter,json_key);
    emitter_json_object_begin(emitter);
    return;
  }
  return;
}

Assistant:

static inline void
emitter_dict_begin(emitter_t *emitter, const char *json_key,
    const char *table_header) {
	if (emitter->output == emitter_output_json) {
		emitter_json_key(emitter, json_key);
		emitter_json_object_begin(emitter);
	} else {
		emitter_table_dict_begin(emitter, table_header);
	}
}